

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<7,_4>::ScatteringLawConstants::verifySize(int NI,int NS)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if (NS < 4) {
    if (NS * 6 + 6 == NI) {
      return;
    }
    tools::Log::error<char_const*>(in_RAX);
    tools::Log::info<char_const*>(in_RAX);
    tools::Log::info<char_const*,int>("NI value: {}",NI);
  }
  else {
    tools::Log::error<char_const*>(in_RAX);
    tools::Log::info<char_const*>(in_RAX);
  }
  tools::Log::info<char_const*,int>("NS value: {}",NS);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NI, int NS ) {

  if ( NS > 3 ) {

    Log::error( "Encountered illegal NS value" );
    Log::info( "NS must be smaller than or equal to 3" );
    Log::info( "NS value: {}", NS );
    throw std::exception();
  }

  if ( NI != 6 * ( NS + 1 ) ) {

    Log::error( "Encountered illegal NI and NS values" );
    Log::info( "NI must be equal to 6*(NS + 1)" );
    Log::info( "NI value: {}", NI );
    Log::info( "NS value: {}", NS );
    throw std::exception();
  }
}